

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  bool bVar6;
  int c;
  int fFile;
  int fHex;
  char *pSopCover;
  char *pStr;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar2 = true;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"xfh"), iVar3 != -1) {
    if (iVar3 == 0x66) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if ((iVar3 == 0x68) || (iVar3 != 0x78)) goto LAB_0039f68e;
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  if (argc == globalUtilOptind + 1) {
    if (bVar1) {
      pSopCover = Extra_FileReadContents(argv[globalUtilOptind]);
    }
    else {
      pSopCover = argv[globalUtilOptind];
    }
    while( true ) {
      sVar4 = strlen(pSopCover);
      bVar6 = true;
      if (pSopCover[sVar4 - 1] != '\n') {
        sVar4 = strlen(pSopCover);
        bVar6 = pSopCover[sVar4 - 1] == '\r';
      }
      if (!bVar6) break;
      sVar4 = strlen(pSopCover);
      pSopCover[sVar4 - 1] = '\0';
    }
    if (bVar2) {
      _fFile = Abc_SopFromTruthHex(pSopCover);
    }
    else {
      _fFile = Abc_SopFromTruthBin(pSopCover);
    }
    if ((bVar1) && (pSopCover != (char *)0x0)) {
      free(pSopCover);
    }
    if ((_fFile == (char *)0x0) || (*_fFile == '\0')) {
      if (_fFile != (char *)0x0) {
        free(_fFile);
      }
      fprintf((FILE *)pAbc->Err,"Reading truth table has failed.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pNtk_00 = Abc_NtkCreateWithNode(_fFile);
      if (_fFile != (char *)0x0) {
        free(_fFile);
      }
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Err,"Deriving the network has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        Abc_FrameClearVerifStatus(pAbc);
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
LAB_0039f68e:
    fprintf((FILE *)pAbc->Err,"usage: read_truth [-xfh] <truth> <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         creates network with node having given truth table\n");
    pcVar5 = "bin";
    if (bVar2) {
      pcVar5 = "hex";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-x     : toggles between bin and hex representation [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (bVar1) {
      pcVar5 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-f     : toggles reading truth table from file [default = %s]\n",
            pcVar5);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,
            "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : file name with the truth table\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pStr = NULL;
    char * pSopCover;
    int fHex  = 1;
    int fFile = 0;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xfh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'f':
                fFile ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
        goto usage;

    if ( fFile )
        pStr = Extra_FileReadContents( argv[globalUtilOptind] );
    else
        pStr = argv[globalUtilOptind];
    while ( pStr[ strlen(pStr) - 1 ] == '\n' || pStr[ strlen(pStr) - 1 ] == '\r' )
        pStr[ strlen(pStr) - 1 ] = '\0';

    // convert truth table to SOP
    if ( fHex )
        pSopCover = Abc_SopFromTruthHex(pStr);
    else
        pSopCover = Abc_SopFromTruthBin(pStr);
    if ( fFile )
        ABC_FREE( pStr );
    if ( pSopCover == NULL || pSopCover[0] == 0 )
    {
        ABC_FREE( pSopCover );
        fprintf( pAbc->Err, "Reading truth table has failed.\n" );
        return 1;
    }

    pNtk = Abc_NtkCreateWithNode( pSopCover );
    ABC_FREE( pSopCover );
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Err, "Deriving the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_truth [-xfh] <truth> <file>\n" );
    fprintf( pAbc->Err, "\t         creates network with node having given truth table\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex?  "hex":"bin" );
    fprintf( pAbc->Err, "\t-f     : toggles reading truth table from file [default = %s]\n",      fFile? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n" );
    fprintf( pAbc->Err, "\tfile   : file name with the truth table\n" );
    return 1;
}